

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Type *pTVar7;
  ulong uVar8;
  uint uVar9;
  int n;
  size_t sVar10;
  long lVar11;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  uVar5 = 0;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar10 = 0;
  }
  else {
    sVar10 = internal::WireFormat::ComputeUnknownFieldsSize
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  sVar6 = internal::WireFormatLite::Int32Size(&this->path_);
  if (sVar6 != 0) {
    uVar5 = (uint)sVar6;
    if ((int)uVar5 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    sVar10 = sVar10 + uVar8;
  }
  this->_path_cached_byte_size_ = uVar5;
  lVar11 = sVar10 + sVar6;
  sVar10 = internal::WireFormatLite::Int32Size(&this->span_);
  if (sVar10 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)sVar10;
    if ((int)uVar5 < 0) {
      uVar8 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    lVar11 = lVar11 + uVar8;
  }
  this->_span_cached_byte_size_ = uVar5;
  uVar5 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  sVar10 = lVar11 + sVar10 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,uVar9);
      uVar4 = (uint)pTVar7->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar10 = sVar10 + pTVar7->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 3) != 0) {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->leading_comments_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar10 = sVar10 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar2 = ((this->trailing_comments_).ptr_)->_M_string_length;
      uVar5 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar10 = sVar10 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  this->_cached_size_ = (int)sVar10;
  return sVar10;
}

Assistant:

size_t SourceCodeInfo_Location::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->span_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated string leading_detached_comments = 6;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->leading_detached_comments_size());
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->leading_detached_comments(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}